

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O2

bool tools::xar::fuse_allows_visible_mounts(string *fuse_conf_path)

{
  uint uVar1;
  bool bVar2;
  istream *piVar3;
  string line;
  ifstream input;
  
  std::ifstream::ifstream((istream *)&input,(string *)fuse_conf_path,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input,(string *)&line);
    uVar1 = *(uint *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20);
    if ((uVar1 & 5) != 0) break;
    bVar2 = std::operator==(&line,"user_allow_other");
  } while (!bVar2);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&input);
  return (uVar1 & 5) == 0;
}

Assistant:

bool tools::xar::fuse_allows_visible_mounts(std::string fuse_conf_path) {
  std::ifstream input(fuse_conf_path);

  std::string line;
  while (std::getline(input, line)) {
    if (line == "user_allow_other") {
      return true;
    }
  }

  return false;
}